

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::SimpleLoggerMgr(SimpleLoggerMgr *this)

{
  undefined1 uVar1;
  __sighandler_t p_Var2;
  void *pvVar3;
  long in_RDI;
  _func_void *__f;
  thread *this_00;
  char *env_segv;
  string env_segv_str;
  char *in_stack_ffffffffffffff38;
  thread *__t;
  undefined4 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  thread local_48;
  char *local_40;
  string local_38 [56];
  
  std::mutex::mutex((mutex *)0x21dff1);
  std::
  unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
  ::unordered_set((unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
                   *)0x21e004);
  std::mutex::mutex((mutex *)0x21e012);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x21e028);
  std::thread::thread((thread *)0x21e03e);
  __f = (_func_void *)(in_RDI + 200);
  std::thread::thread((thread *)0x21e054);
  this_00 = (thread *)(in_RDI + 0xd0);
  std::__cxx11::list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>::
  list((list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_> *)0x21e06a);
  std::mutex::mutex((mutex *)0x21e07b);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x110));
  std::mutex::mutex((mutex *)0x21e0a2);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x168));
  std::mutex::mutex((mutex *)0x21e0c9);
  std::atomic<bool>::atomic
            ((atomic<bool> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                )))),
             SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
  *(undefined8 *)(in_RDI + 0x1c8) = 0;
  *(undefined8 *)(in_RDI + 0x1d0) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1d8));
  *(undefined8 *)(in_RDI + 0x1f8) = 0;
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                )))),(__integral_type)in_stack_ffffffffffffff38);
  std::__cxx11::string::string((string *)(in_RDI + 0x208));
  std::ofstream::ofstream((void *)(in_RDI + 0x228));
  *(undefined1 *)(in_RDI + 0x428) = 1;
  *(undefined1 *)(in_RDI + 0x429) = 0;
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                )))),(__integral_type)in_stack_ffffffffffffff38);
  std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::vector
            ((vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
              *)0x21e195);
  std::__cxx11::string::string(local_38);
  local_40 = getenv("SIMPLELOGGER_HANDLE_SEGV");
  if (local_40 != (char *)0x0) {
    std::__cxx11::string::operator=(local_38,local_40);
  }
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff47,
                                   CONCAT16(in_stack_ffffffffffffff46,
                                            CONCAT15(in_stack_ffffffffffffff45,
                                                     CONCAT14(in_stack_ffffffffffffff44,
                                                              in_stack_ffffffffffffff40)))),
                          in_stack_ffffffffffffff38);
  if ((((!(bool)uVar1) &&
       (in_stack_ffffffffffffff46 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff46,
                                                     CONCAT15(in_stack_ffffffffffffff45,
                                                              CONCAT14(in_stack_ffffffffffffff44,
                                                                       in_stack_ffffffffffffff40))))
                             ,in_stack_ffffffffffffff38), !(bool)in_stack_ffffffffffffff46)) &&
      (in_stack_ffffffffffffff45 =
            std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff46,
                                                    CONCAT15(in_stack_ffffffffffffff45,
                                                             CONCAT14(in_stack_ffffffffffffff44,
                                                                      in_stack_ffffffffffffff40)))),
                            in_stack_ffffffffffffff38), !(bool)in_stack_ffffffffffffff45)) &&
     (in_stack_ffffffffffffff44 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff46,
                                                   CONCAT15(in_stack_ffffffffffffff45,
                                                            CONCAT14(in_stack_ffffffffffffff44,
                                                                     in_stack_ffffffffffffff40)))),
                           in_stack_ffffffffffffff38), !(bool)in_stack_ffffffffffffff44)) {
    p_Var2 = signal(0xb,handleSegFault);
    *(__sighandler_t *)(in_RDI + 0x1c8) = p_Var2;
    p_Var2 = signal(6,handleSegAbort);
    *(__sighandler_t *)(in_RDI + 0x1d0) = p_Var2;
  }
  pvVar3 = malloc(0x10000);
  *(void **)(in_RDI + 0x1f8) = pvVar3;
  std::thread::thread<void(&)(),,void>(this_00,__f);
  __t = &local_48;
  std::thread::operator=
            ((thread *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff46,
                                     CONCAT15(in_stack_ffffffffffffff45,
                                              CONCAT14(in_stack_ffffffffffffff44,
                                                       in_stack_ffffffffffffff40)))),__t);
  std::thread::~thread((thread *)0x21e354);
  std::thread::thread<void(&)(),,void>(this_00,__f);
  std::thread::operator=
            ((thread *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff46,
                                     CONCAT15(in_stack_ffffffffffffff45,
                                              CONCAT14(in_stack_ffffffffffffff44,
                                                       in_stack_ffffffffffffff40)))),__t);
  std::thread::~thread((thread *)0x21e387);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

SimpleLoggerMgr::SimpleLoggerMgr()
    : termination(false)
    , oldSigSegvHandler(nullptr)
    , oldSigAbortHandler(nullptr)
    , stackTraceBuffer(nullptr)
    , crashOriginThread(0)
    , crashDumpOriginOnly(true)
    , exitOnCrash(false)
    , abortTimer(0)
{
#if defined(__linux__) || defined(__APPLE__)
    std::string env_segv_str;
    const char* env_segv = std::getenv("SIMPLELOGGER_HANDLE_SEGV");
    if (env_segv) env_segv_str = env_segv;

    if ( env_segv_str == "OFF" ||
         env_segv_str == "off" ||
         env_segv_str == "FALSE" ||
         env_segv_str == "false" ) {
        // Manually turned off by user, via env var.
    } else {
        oldSigSegvHandler = signal(SIGSEGV, SimpleLoggerMgr::handleSegFault);
        oldSigAbortHandler = signal(SIGABRT, SimpleLoggerMgr::handleSegAbort);
    }
    stackTraceBuffer = (char*)malloc(stackTraceBufferSize);

#endif
    tFlush = std::thread(SimpleLoggerMgr::flushWorker);
    tCompress = std::thread(SimpleLoggerMgr::compressWorker);
}